

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int Gia_ManMarkDangling(Gia_Man_t *p)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = 0;
  do {
    if ((p->nObjs <= iVar4) || (pGVar2 = Gia_ManObj(p,iVar4), pGVar2 == (Gia_Obj_t *)0x0)) {
      iVar4 = 0;
      iVar5 = 0;
      while( true ) {
        if (p->nObjs <= iVar4) {
          return iVar5;
        }
        pGVar2 = Gia_ManObj(p,iVar4);
        if (pGVar2 == (Gia_Obj_t *)0x0) break;
        iVar5 = iVar5 + (uint)((*(ulong *)pGVar2 & 0xc0000000) == 0 &&
                              (~(uint)*(ulong *)pGVar2 & 0x1fffffff) != 0);
        iVar4 = iVar4 + 1;
      }
      return iVar5;
    }
    uVar1 = *(ulong *)pGVar2;
    *(ulong *)pGVar2 = uVar1 & 0xffffffffbfffffff;
    uVar3 = uVar1 & 0x1fffffff;
    if (uVar3 == 0x1fffffff || (int)uVar1 < 0) {
      if ((int)uVar1 < 0 && (int)uVar3 != 0x1fffffff) goto LAB_0061a0fa;
    }
    else {
      pGVar2[-uVar3].field_0x3 = pGVar2[-uVar3].field_0x3 | 0x40;
      uVar3 = (ulong)(*(uint *)&pGVar2->field_0x4 & 0x1fffffff);
LAB_0061a0fa:
      pGVar2[-uVar3].field_0x3 = pGVar2[-uVar3].field_0x3 | 0x40;
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

int Gia_ManMarkDangling( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        pObj->fMark0 = 0;
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjFanin0(pObj)->fMark0 = 1;
            Gia_ObjFanin1(pObj)->fMark0 = 1;
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
    }
    Gia_ManForEachAnd( p, pObj, i )
        Counter += !pObj->fMark0;
    return Counter;
}